

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O1

uint Rsb_DecPerformInt(Rsb_Man_t *p,int nVars,word *f,word **g,int nGs,int nGsAll,int fFindAll)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  word wVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  Rsb_Man_t *pRVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  word *__s;
  uint uTruth;
  int iCexB;
  int iCexA;
  word *pDivs [16];
  uint local_134;
  int local_130;
  int local_12c;
  ulong local_128;
  uint local_11c;
  ulong local_118;
  ulong local_110;
  word *local_108;
  ulong local_100;
  Rsb_Man_t *local_f8;
  int local_ec;
  word *local_e8;
  ulong local_e0;
  word **local_d8;
  uint *local_d0;
  ulong local_c8;
  ulong local_c0;
  word *local_b8 [17];
  
  __s = p->vCexes->pArray;
  local_d0 = (uint *)p->vDecPats->pArray;
  local_134 = 0;
  local_11c = nGsAll;
  local_ec = nVars;
  local_e8 = f;
  memset(__s,0,(long)nGsAll << 3);
  p->vTries->nSize = 0;
  p->vFanins->nSize = 1;
  local_128 = 0;
  local_e0 = CONCAT44(local_e0._4_4_,nGs);
  local_108 = __s;
  local_f8 = p;
  local_d8 = g;
  if (0 < nGs) {
    local_110 = (ulong)local_11c;
    uVar13 = (ulong)(uint)nGs;
    uVar9 = 0;
    local_128 = 0;
    local_100 = uVar13;
    do {
      if (__s[uVar9] == 0) {
        local_b8[0] = g[uVar9];
        pVVar2 = local_f8->vFanins;
        *pVVar2->pArray = (int)uVar9;
        local_134 = Rsb_DecCheck(local_ec,local_e8,local_b8,pVVar2->nSize,local_d0,&local_12c,
                                 &local_130);
        local_118 = uVar9;
        if (local_134 == 0) {
          if ((int)local_128 == 0x40) {
            return 0;
          }
          iVar4 = local_12c >> 6;
          bVar6 = (byte)local_12c & 0x3f;
          iVar8 = local_130 >> 6;
          bVar7 = (byte)local_130 & 0x3f;
          uVar1 = local_f8->vFanins->nSize;
          if ((((uint)(local_e8[iVar8] >> bVar7) ^ (uint)(local_e8[iVar4] >> bVar6)) & 1) == 0) {
            puts("Verification of CEX has failed: f(A) == f(B)!!!");
          }
          if (0 < (int)uVar1) {
            uVar13 = 0;
            do {
              if ((((uint)(local_b8[uVar13][iVar8] >> bVar7) ^
                   (uint)(local_b8[uVar13][iVar4] >> bVar6)) & 1) != 0) {
                printf("Verification of CEX has failed: g[%d](A) != g[%d](B)!!!\n",
                       uVar13 & 0xffffffff,uVar13 & 0xffffffff);
              }
              uVar13 = uVar13 + 1;
            } while (uVar1 != uVar13);
          }
          g = local_d8;
          pRVar11 = local_f8;
          uVar9 = local_118;
          iVar12 = (int)local_128;
          if (0x3f < iVar12) {
LAB_005de598:
            __assert_fail("nCexes < 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/rsb/rsbDec6.c"
                          ,99,"void Rsb_DecRecordCex(word **, int, int, int, word *, int)");
          }
          if (0 < (int)local_11c) {
            uVar13 = 0;
            do {
              if ((((uint)(local_d8[uVar13][iVar8] >> bVar7) ^
                   (uint)(local_d8[uVar13][iVar4] >> bVar6)) & 1) == 0) {
                local_108[(long)(iVar12 >> 6) + uVar13] =
                     local_108[(long)(iVar12 >> 6) + uVar13] | 1L << ((byte)local_128 & 0x3f);
              }
              uVar13 = uVar13 + 1;
            } while (local_110 != uVar13);
          }
          local_128 = (ulong)(iVar12 + 1);
          uVar13 = local_100;
          __s = local_108;
          if (local_f8->fVerbose != 0) {
            Vec_IntPush(local_f8->vTries,(int)local_118);
            Vec_IntPush(pRVar11->vTries,-1);
            uVar13 = local_100;
            __s = local_108;
          }
        }
        else {
          if (fFindAll == 0) {
            return local_134;
          }
          local_134 = (local_134 & 3) * 0x55555555;
          Kit_DsdPrintFromTruth(&local_134,1);
          printf("   ");
          pVVar2 = local_f8->vFanins;
          printf("Vector has %d entries: {",(ulong)(uint)pVVar2->nSize);
          if (0 < pVVar2->nSize) {
            lVar15 = 0;
            do {
              printf(" %d",(ulong)(uint)pVVar2->pArray[lVar15]);
              lVar15 = lVar15 + 1;
            } while (lVar15 < pVVar2->nSize);
          }
          puts(" }");
          uVar9 = local_118;
          __s = local_108;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar13);
  }
  if (local_f8->nDecMax != 1) {
    local_f8->vFanins->nSize = 2;
    pRVar11 = local_f8;
    if (1 < (int)local_e0) {
      local_118 = (ulong)local_11c;
      local_c8 = local_e0 & 0xffffffff;
      uVar13 = 1;
      do {
        uVar9 = 0;
        local_100 = uVar13;
        do {
          if ((__s[uVar13] & __s[uVar9]) == 0) {
            local_b8[0] = g[uVar13];
            pVVar2 = pRVar11->vFanins;
            piVar3 = pVVar2->pArray;
            *piVar3 = (int)uVar13;
            local_b8[1] = g[uVar9];
            piVar3[1] = (int)uVar9;
            local_134 = Rsb_DecCheck(local_ec,local_e8,local_b8,pVVar2->nSize,local_d0,&local_12c,
                                     &local_130);
            local_110 = uVar9;
            if (local_134 == 0) {
              if ((int)local_128 == 0x40) {
                return 0;
              }
              iVar4 = local_12c >> 6;
              bVar6 = (byte)local_12c & 0x3f;
              iVar8 = local_130 >> 6;
              bVar7 = (byte)local_130 & 0x3f;
              uVar1 = pRVar11->vFanins->nSize;
              if ((((uint)(local_e8[iVar8] >> bVar7) ^ (uint)(local_e8[iVar4] >> bVar6)) & 1) == 0)
              {
                puts("Verification of CEX has failed: f(A) == f(B)!!!");
              }
              if (0 < (int)uVar1) {
                uVar13 = 0;
                do {
                  if ((((uint)(local_b8[uVar13][iVar8] >> bVar7) ^
                       (uint)(local_b8[uVar13][iVar4] >> bVar6)) & 1) != 0) {
                    printf("Verification of CEX has failed: g[%d](A) != g[%d](B)!!!\n",
                           uVar13 & 0xffffffff,uVar13 & 0xffffffff);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar1 != uVar13);
              }
              g = local_d8;
              pRVar11 = local_f8;
              uVar13 = local_100;
              __s = local_108;
              if (0x3f < (int)local_128) goto LAB_005de598;
              if (0 < (int)local_11c) {
                uVar9 = 0;
                do {
                  if ((((uint)(local_d8[uVar9][iVar8] >> bVar7) ^
                       (uint)(local_d8[uVar9][iVar4] >> bVar6)) & 1) == 0) {
                    local_108[(long)((int)local_128 >> 6) + uVar9] =
                         local_108[(long)((int)local_128 >> 6) + uVar9] |
                         1L << ((byte)local_128 & 0x3f);
                  }
                  uVar9 = uVar9 + 1;
                } while (local_118 != uVar9);
              }
              local_128 = (ulong)((int)local_128 + 1);
              uVar9 = local_110;
              if (local_f8->fVerbose != 0) {
                Vec_IntPush(local_f8->vTries,(int)local_100);
                uVar9 = local_110;
                Vec_IntPush(pRVar11->vTries,(int)local_110);
                Vec_IntPush(pRVar11->vTries,-1);
              }
            }
            else {
              if (fFindAll == 0) {
                return local_134;
              }
              local_134 = (local_134 & 0xf) * 0x11111111;
              Kit_DsdPrintFromTruth(&local_134,2);
              printf("   ");
              pVVar2 = pRVar11->vFanins;
              printf("Vector has %d entries: {",(ulong)(uint)pVVar2->nSize);
              if (0 < pVVar2->nSize) {
                lVar15 = 0;
                do {
                  printf(" %d",(ulong)(uint)pVVar2->pArray[lVar15]);
                  lVar15 = lVar15 + 1;
                } while (lVar15 < pVVar2->nSize);
              }
              puts(" }");
              uVar9 = local_110;
              __s = local_108;
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar13);
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_c8);
    }
    if (pRVar11->nDecMax != 2) {
      pRVar11->vFanins->nSize = 3;
      if (2 < (int)local_e0) {
        local_c8 = (ulong)local_11c;
        local_c0 = local_e0 & 0xffffffff;
        uVar13 = 2;
        do {
          uVar9 = 1;
          local_110 = uVar13;
          do {
            uVar14 = 0;
            local_118 = uVar9;
            do {
              if ((__s[uVar14] & __s[uVar9] & __s[uVar13]) == 0) {
                local_b8[0] = g[uVar13];
                pVVar2 = pRVar11->vFanins;
                piVar3 = pVVar2->pArray;
                *piVar3 = (int)uVar13;
                local_b8[1] = g[uVar9];
                piVar3[1] = (int)uVar9;
                local_b8[2] = g[uVar14];
                piVar3[2] = (int)uVar14;
                local_134 = Rsb_DecCheck(local_ec,local_e8,local_b8,pVVar2->nSize,local_d0,
                                         &local_12c,&local_130);
                if (local_134 == 0) {
                  if ((int)local_128 == 0x40) {
                    return 0;
                  }
                  iVar4 = local_12c >> 6;
                  bVar6 = (byte)local_12c & 0x3f;
                  iVar8 = local_130 >> 6;
                  bVar7 = (byte)local_130 & 0x3f;
                  uVar1 = pRVar11->vFanins->nSize;
                  local_100 = uVar14;
                  if ((((uint)(local_e8[iVar8] >> bVar7) ^ (uint)(local_e8[iVar4] >> bVar6)) & 1) ==
                      0) {
                    puts("Verification of CEX has failed: f(A) == f(B)!!!");
                  }
                  if (0 < (int)uVar1) {
                    uVar13 = 0;
                    do {
                      if ((((uint)(local_b8[uVar13][iVar8] >> bVar7) ^
                           (uint)(local_b8[uVar13][iVar4] >> bVar6)) & 1) != 0) {
                        printf("Verification of CEX has failed: g[%d](A) != g[%d](B)!!!\n",
                               uVar13 & 0xffffffff,uVar13 & 0xffffffff);
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar1 != uVar13);
                  }
                  g = local_d8;
                  pRVar11 = local_f8;
                  uVar13 = local_110;
                  if (0x3f < (int)local_128) goto LAB_005de598;
                  if (0 < (int)local_11c) {
                    uVar9 = 0;
                    do {
                      if ((((uint)(local_d8[uVar9][iVar8] >> bVar7) ^
                           (uint)(local_d8[uVar9][iVar4] >> bVar6)) & 1) == 0) {
                        local_108[(long)((int)local_128 >> 6) + uVar9] =
                             local_108[(long)((int)local_128 >> 6) + uVar9] |
                             1L << ((byte)local_128 & 0x3f);
                      }
                      uVar9 = uVar9 + 1;
                    } while (local_c8 != uVar9);
                  }
                  local_128 = (ulong)((int)local_128 + 1);
                  uVar9 = local_118;
                  uVar14 = local_100;
                  __s = local_108;
                  if (local_f8->fVerbose != 0) {
                    Vec_IntPush(local_f8->vTries,(int)local_110);
                    uVar9 = local_118;
                    Vec_IntPush(pRVar11->vTries,(int)local_118);
                    uVar14 = local_100;
                    Vec_IntPush(pRVar11->vTries,(int)local_100);
                    Vec_IntPush(pRVar11->vTries,-1);
                    __s = local_108;
                  }
                }
                else {
                  if (fFindAll == 0) {
                    return local_134;
                  }
                  local_134 = (local_134 & 0xff) * 0x1010101;
                  Kit_DsdPrintFromTruth(&local_134,3);
                  printf("   ");
                  pVVar2 = pRVar11->vFanins;
                  printf("Vector has %d entries: {",(ulong)(uint)pVVar2->nSize);
                  if (0 < pVVar2->nSize) {
                    lVar15 = 0;
                    do {
                      printf(" %d",(ulong)(uint)pVVar2->pArray[lVar15]);
                      lVar15 = lVar15 + 1;
                    } while (lVar15 < pVVar2->nSize);
                  }
                  puts(" }");
                  uVar13 = local_110;
                  uVar9 = local_118;
                  __s = local_108;
                }
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar9);
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar13);
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_c0);
      }
      if (pRVar11->nDecMax != 3) {
        pRVar11->vFanins->nSize = 4;
        if ((int)local_e0 < 4) {
          return 0;
        }
        local_e0 = local_e0 & 0xffffffff;
        uVar13 = 3;
        do {
          uVar9 = 2;
          do {
            uVar14 = 1;
            local_118 = uVar9;
            do {
              uVar10 = 0;
              do {
                if ((__s[uVar10] & __s[uVar9] & __s[uVar13] & __s[uVar14]) == 0) {
                  local_b8[0] = local_d8[uVar13];
                  pVVar2 = local_f8->vFanins;
                  piVar3 = pVVar2->pArray;
                  *piVar3 = (int)uVar13;
                  local_b8[1] = local_d8[uVar9];
                  piVar3[1] = (int)uVar9;
                  local_b8[2] = local_d8[uVar14];
                  piVar3[2] = (int)uVar14;
                  local_b8[3] = local_d8[uVar10];
                  piVar3[3] = (int)uVar10;
                  local_134 = Rsb_DecCheck(local_ec,local_e8,local_b8,pVVar2->nSize,local_d0,
                                           &local_12c,&local_130);
                  pRVar11 = local_f8;
                  iVar4 = local_12c;
                  if (local_134 == 0) {
                    iVar8 = (int)local_128;
                    if (iVar8 == 0x40) {
                      return 0;
                    }
                    local_100 = CONCAT44(local_100._4_4_,local_130);
                    Rsb_DecVerifyCex(local_e8,local_b8,local_f8->vFanins->nSize,local_12c,local_130)
                    ;
                    __s = local_108;
                    local_110 = CONCAT44(local_110._4_4_,iVar8 + 1);
                    Rsb_DecRecordCex(local_d8,local_11c,iVar4,(int)local_100,local_108,iVar8);
                    if (pRVar11->fVerbose == 0) {
                      local_128 = local_110 & 0xffffffff;
                      uVar9 = local_118;
                    }
                    else {
                      Vec_IntPush(pRVar11->vTries,(int)uVar13);
                      uVar9 = local_118;
                      Vec_IntPush(pRVar11->vTries,(int)local_118);
                      Vec_IntPush(pRVar11->vTries,(int)uVar14);
                      Vec_IntPush(pRVar11->vTries,(int)uVar10);
                      Vec_IntPush(pRVar11->vTries,-1);
                      local_128 = local_110 & 0xffffffff;
                    }
                  }
                  else {
                    if (fFindAll == 0) {
                      return local_134;
                    }
                    wVar5 = Abc_Tt6Stretch((ulong)local_134,4);
                    local_134 = (uint)wVar5;
                    Kit_DsdPrintFromTruth(&local_134,4);
                    printf("   ");
                    Vec_IntPrint(local_f8->vFanins);
                    uVar9 = local_118;
                  }
                }
                uVar10 = uVar10 + 1;
              } while (uVar14 != uVar10);
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar9);
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar13);
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_e0);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

unsigned Rsb_DecPerformInt( Rsb_Man_t * p, int nVars, word * f, word ** g, int nGs, int nGsAll, int fFindAll ) 
{
    word * pCexes = Vec_WrdArray(p->vCexes);
    unsigned * pPat = (unsigned *)Vec_IntArray(p->vDecPats);
    /*
    The following filtering hueristic can be used:
    after the first round (if there is more than 5 cexes, 
    remove all the divisors, except fanins of the node
    This should lead to a speadup without sacrifying quality.

    Another idea is to precompute several counter-examples
    like the first and last 0 and 1 mints of the function
    which yields 4 cexes.
    */

    word * pDivs[16];
    unsigned uTruth = 0;
    int i, k, j, n, iCexA, iCexB, nCexes = 0;
    memset( pCexes, 0, sizeof(word) * nGsAll );  
    Vec_IntClear( p->vTries );
    // populate the counter-examples with the three most obvious
//    nCexes = Rsb_DecInitCexes( nVars, f, g, nGs, nGsAll, pCexes, vTries );
    // start by checking each function
    p->vFanins->nSize = 1;
    for ( i = 0; i < nGs; i++ )
    {
        if ( pCexes[i] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 1 );
                Kit_DsdPrintFromTruth( &uTruth, 1 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 1 )
        return 0;
    // continue by checking pairs
    p->vFanins->nSize = 2;
    for ( i = 1; i < nGs; i++ )
    for ( k = 0; k < i; k++ )
    {
        if ( pCexes[i] & pCexes[k] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 2 );
                Kit_DsdPrintFromTruth( &uTruth, 2 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 2 )
        return 0;
    // continue by checking triples
    p->vFanins->nSize = 3;
    for ( i = 2; i < nGs; i++ )
    for ( k = 1; k < i; k++ )
    for ( j = 0; j < k; j++ )
    {
        if ( pCexes[i] & pCexes[k] & pCexes[j] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        pDivs[2] = g[j];  p->vFanins->pArray[2] = j;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 3 );
                Kit_DsdPrintFromTruth( &uTruth, 3 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, j );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 3 )
        return 0;
    // continue by checking quadras
    p->vFanins->nSize = 4;
    for ( i = 3; i < nGs; i++ )
    for ( k = 2; k < i; k++ )
    for ( j = 1; j < k; j++ )
    for ( n = 0; n < j; n++ )
    {
        if ( pCexes[i] & pCexes[k] & pCexes[j] & pCexes[n] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        pDivs[2] = g[j];  p->vFanins->pArray[2] = j;
        pDivs[3] = g[n];  p->vFanins->pArray[3] = n;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 4 );
                Kit_DsdPrintFromTruth( &uTruth, 4 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, j );
        Vec_IntPush( p->vTries, n );
        Vec_IntPush( p->vTries, -1 );
    }
//    printf( "%d ", nCexes );
    if ( p->nDecMax == 4 )
        return 0;
    return 0;
}